

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_PrintToTest_x_iutest_x_RawArray_Test::Body
          (iu_PrintToTest_x_iutest_x_RawArray_Test *this)

{
  Fixed *pFVar1;
  uchar (*v) [3];
  uchar (*v_00) [3];
  char (*v_01) [3];
  char (*v_02) [3];
  AssertionHelper local_f00;
  string local_ed0;
  Fixed local_eb0;
  AssertionHelper local_d28;
  string local_cf8;
  Fixed local_cd8;
  AssertionHelper local_b50;
  string local_b20;
  Fixed local_b00;
  AssertionHelper local_978;
  string local_948;
  Fixed local_928;
  undefined2 local_7a0;
  undefined1 local_79e;
  undefined2 local_79c;
  undefined1 local_79a;
  char d_1 [3];
  char c_1 [3];
  char b_1 [3];
  char a_1 [3];
  string local_760;
  Fixed local_740;
  AssertionHelper local_5b8;
  string local_588;
  Fixed local_568;
  AssertionHelper local_3e0;
  string local_3b0;
  Fixed local_390;
  AssertionHelper local_208;
  string local_1c8;
  Fixed local_1a8;
  undefined2 local_20;
  undefined1 local_1e;
  undefined2 local_1c;
  undefined1 local_1a;
  uchar d [3];
  uchar c [3];
  uchar b [3];
  uchar a [3];
  iu_PrintToTest_x_iutest_x_RawArray_Test *this_local;
  
  c[2] = '\x02';
  c[0] = '\0';
  c[1] = '\x01';
  d[2] = '\x02';
  d[0] = '\0';
  d[1] = '\x01';
  local_1a = 2;
  local_1c = 0x100;
  local_1e = 2;
  local_20 = 0x100;
  memset(&local_1a8,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_1a8);
  iutest::PrintToString<unsigned_char[3]>(&local_1c8,&c);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_1a8,&local_1c8);
  iutest::AssertionHelper::AssertionHelper
            (&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3eb,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_208,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_208);
  std::__cxx11::string::~string((string *)&local_1c8);
  iutest::AssertionHelper::Fixed::~Fixed(&local_1a8);
  memset(&local_390,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_390);
  iutest::PrintToString<unsigned_char[3]>(&local_3b0,&d);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_390,&local_3b0);
  iutest::AssertionHelper::AssertionHelper
            (&local_3e0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3ec,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_3e0,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_3e0);
  std::__cxx11::string::~string((string *)&local_3b0);
  iutest::AssertionHelper::Fixed::~Fixed(&local_390);
  memset(&local_568,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_568);
  iutest::PrintToString<unsigned_char_volatile[3]>(&local_588,(iutest *)&local_1c,v);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_568,&local_588);
  iutest::AssertionHelper::AssertionHelper
            (&local_5b8,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3ed,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_5b8,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_5b8);
  std::__cxx11::string::~string((string *)&local_588);
  iutest::AssertionHelper::Fixed::~Fixed(&local_568);
  memset(&local_740,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_740);
  iutest::PrintToString<unsigned_char_volatile[3]>(&local_760,(iutest *)&local_20,v_00);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_740,&local_760);
  iutest::AssertionHelper::AssertionHelper
            ((AssertionHelper *)b_1,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3ee,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=((AssertionHelper *)b_1,pFVar1);
  iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)b_1);
  std::__cxx11::string::~string((string *)&local_760);
  iutest::AssertionHelper::Fixed::~Fixed(&local_740);
  c_1[2] = '\x02';
  c_1[0] = '\0';
  c_1[1] = '\x01';
  d_1[2] = '\x02';
  d_1[0] = '\0';
  d_1[1] = '\x01';
  local_79a = 2;
  local_79c = 0x100;
  local_79e = 2;
  local_7a0 = 0x100;
  memset(&local_928,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_928);
  iutest::PrintToString<char[3]>(&local_948,&c_1);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_928,&local_948);
  iutest::AssertionHelper::AssertionHelper
            (&local_978,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3f6,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_978,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_978);
  std::__cxx11::string::~string((string *)&local_948);
  iutest::AssertionHelper::Fixed::~Fixed(&local_928);
  memset(&local_b00,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_b00);
  iutest::PrintToString<char[3]>(&local_b20,&d_1);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_b00,&local_b20);
  iutest::AssertionHelper::AssertionHelper
            (&local_b50,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3f7,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_b50,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_b50);
  std::__cxx11::string::~string((string *)&local_b20);
  iutest::AssertionHelper::Fixed::~Fixed(&local_b00);
  memset(&local_cd8,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_cd8);
  iutest::PrintToString<char_volatile[3]>(&local_cf8,(iutest *)&local_79c,v_01);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_cd8,&local_cf8);
  iutest::AssertionHelper::AssertionHelper
            (&local_d28,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3f8,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_d28,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_d28);
  std::__cxx11::string::~string((string *)&local_cf8);
  iutest::AssertionHelper::Fixed::~Fixed(&local_cd8);
  memset(&local_eb0,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_eb0);
  iutest::PrintToString<char_volatile[3]>(&local_ed0,(iutest *)&local_7a0,v_02);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_eb0,&local_ed0);
  iutest::AssertionHelper::AssertionHelper
            (&local_f00,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3f9,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_f00,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_f00);
  std::__cxx11::string::~string((string *)&local_ed0);
  iutest::AssertionHelper::Fixed::~Fixed(&local_eb0);
  return;
}

Assistant:

IUTEST(PrintToTest, RawArray)
{
    {
        unsigned char a[3] = {0, 1, 2};
        const unsigned char b[3] = {0, 1, 2};
        const volatile unsigned char c[3] = {0, 1, 2};
        volatile unsigned char d[3] = {0, 1, 2};

        IUTEST_SUCCEED() << ::iutest::PrintToString(a);
        IUTEST_SUCCEED() << ::iutest::PrintToString(b);
        IUTEST_SUCCEED() << ::iutest::PrintToString(c);
        IUTEST_SUCCEED() << ::iutest::PrintToString(d);
    }
    {
        char a[3] = {0, 1, 2};
        const char b[3] = {0, 1, 2};
        const volatile char c[3] = {0, 1, 2};
        volatile char d[3] = {0, 1, 2};

        IUTEST_SUCCEED() << ::iutest::PrintToString(a);
        IUTEST_SUCCEED() << ::iutest::PrintToString(b);
        IUTEST_SUCCEED() << ::iutest::PrintToString(c);
        IUTEST_SUCCEED() << ::iutest::PrintToString(d);
    }
}